

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

bool __thiscall HighsTimer::running(HighsTimer *this,HighsInt i_clock)

{
  undefined8 uVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI == -0x2e) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x60),0xffffffffffffffd2);
    uVar1 = std::__cxx11::string::c_str();
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),
                        0xffffffffffffffd2);
    printf("HighsTimer: querying clock %d: %s - with start record %g\n",*pvVar2,0xffffffd2,uVar1);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)in_ESI);
  return *pvVar2 <= 0.0 && *pvVar2 != 0.0;
}

Assistant:

bool running(const HighsInt i_clock = 0  //!< Index of the clock to be read
  ) {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    if (i_clock == check_clock) {
      printf("HighsTimer: querying clock %d: %s - with start record %g\n",
             int(check_clock), this->clock_names[check_clock].c_str(),
             clock_start[i_clock]);
    }
    return clock_start[i_clock] < 0;
  }